

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libretro_main.c
# Opt level: O3

void retro_run(void)

{
  fb_color_t *pfVar1;
  char *pcVar2;
  _Bool _Var3;
  int16_t iVar4;
  gbstatus_e gVar5;
  char *pcVar6;
  int y;
  long lVar7;
  uint uVar8;
  char *pcVar9;
  int x;
  long lVar10;
  uint uVar11;
  _Bool var_updated;
  char local_19;
  
  local_19 = '\0';
  _Var3 = (*env_cb)(0x11,&local_19);
  if ((_Var3) && (local_19 == '\x01')) {
    check_variables();
  }
  iVar4 = (*input_state_cb)(0,1,0,8);
  uVar8 = (uint)(iVar4 != 0) * 0x10;
  iVar4 = (*input_state_cb)(0,1,0,0);
  uVar11 = uVar8 + 0x20;
  if (iVar4 == 0) {
    uVar11 = uVar8;
  }
  iVar4 = (*input_state_cb)(0,1,0,2);
  uVar8 = uVar11 + 0x40;
  if (iVar4 == 0) {
    uVar8 = uVar11;
  }
  iVar4 = (*input_state_cb)(0,1,0,3);
  uVar11 = uVar8 | 0x80;
  if (iVar4 == 0) {
    uVar11 = uVar8;
  }
  iVar4 = (*input_state_cb)(0,1,0,4);
  uVar8 = uVar11 | 4;
  if (iVar4 == 0) {
    uVar8 = uVar11;
  }
  iVar4 = (*input_state_cb)(0,1,0,5);
  uVar11 = uVar8 | 8;
  if (iVar4 == 0) {
    uVar11 = uVar8;
  }
  iVar4 = (*input_state_cb)(0,1,0,6);
  uVar8 = uVar11 | 2;
  if (iVar4 == 0) {
    uVar8 = uVar11;
  }
  iVar4 = (*input_state_cb)(0,1,0,7);
  gb_emu_update_input(&gb_emu,iVar4 != 0 | uVar8);
  do {
    if (*gb_frame_ready_ptr != false) {
      gb_emu_grab_frame(&gb_emu);
      pcVar2 = out_framebuffer;
      pfVar1 = curr_color_scheme;
      lVar7 = 0;
      pcVar6 = gb_framebuffer;
      pcVar9 = out_framebuffer;
      do {
        lVar10 = 0;
        do {
          *(fb_color_t *)(pcVar9 + lVar10 * 4) = pfVar1[pcVar6[lVar10]];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0xa0);
        lVar7 = lVar7 + 1;
        pcVar9 = pcVar9 + 0x280;
        pcVar6 = pcVar6 + 0xa0;
      } while (lVar7 != 0x90);
      (*video_cb)(pcVar2,0xa0,0x90,0x280);
      (*audio_cb)(0,0);
      return;
    }
    gVar5 = gb_emu_step(&gb_emu);
  } while (gVar5 == GBSTATUS_OK);
  osd_msg("%s ([%s] %s)\n","Emulation error!",gbstatus_str_repr[gVar5],gbstatus_str);
  return;
}

Assistant:

void retro_run()
{
   gbstatus_e status = GBSTATUS_OK;

   bool var_updated = false;
   if (env_cb(RETRO_ENVIRONMENT_GET_VARIABLE_UPDATE, &var_updated) && var_updated)
      check_variables();

   int joypad_state = 0;

   if (input_state_cb(0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_A))
      joypad_state |= BUTTON_A;

   if (input_state_cb(0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_B))
      joypad_state |= BUTTON_B;

   if (input_state_cb(0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_SELECT))
      joypad_state |= BUTTON_SELECT;

   if (input_state_cb(0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_START))
      joypad_state |= BUTTON_START;

   if (input_state_cb(0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_UP))
      joypad_state |= BUTTON_UP;

   if (input_state_cb(0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_DOWN))
      joypad_state |= BUTTON_DOWN;

   if (input_state_cb(0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_LEFT))
      joypad_state |= BUTTON_LEFT;

   if (input_state_cb(0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_RIGHT))
      joypad_state |= BUTTON_RIGHT;

   gb_emu_update_input(&gb_emu, joypad_state);

   while (!(*gb_frame_ready_ptr))
   {
      status = gb_emu_step(&gb_emu);
      if (status != GBSTATUS_OK)
      {
         GBSTATUS_ERR_PRINT("Emulation error!");
         return;
      }
   }

   gb_emu_grab_frame(&gb_emu);

   for (int y = 0; y < GB_SCREEN_HEIGHT; y++)
   {
      for (int x = 0; x < GB_SCREEN_WIDTH; x++)
      {
         char gb_color = gb_framebuffer[y * GB_SCREEN_WIDTH + x];
         memcpy(out_framebuffer + (y * GB_SCREEN_WIDTH + x) * 4, &curr_color_scheme[gb_color], sizeof(fb_color_t));
      }
   }

   video_cb(out_framebuffer, GB_SCREEN_WIDTH, GB_SCREEN_HEIGHT, GB_SCREEN_WIDTH * 4);
   audio_cb(0, 0);
}